

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testConstructors<float>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  float fVar3;
  Interval<float> b_3;
  float p1_1;
  float p0_1;
  Interval<float> b_2;
  float p1;
  float p0;
  Interval<float> b_1;
  float p;
  Interval<float> b;
  Interval<float> local_3c;
  float local_34;
  float local_30;
  Interval<float> local_2c;
  float local_24;
  float local_20;
  Interval<float> local_1c;
  float local_14;
  float local_10;
  float local_c;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16aa32);
  fVar3 = std::numeric_limits<float>::max();
  bVar1 = false;
  if ((local_10 == fVar3) && (!NAN(local_10) && !NAN(fVar3))) {
    fVar3 = std::numeric_limits<float>::lowest();
    bVar1 = local_c == fVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x29,"void (anonymous namespace)::testConstructors(const char *) [T = float]");
  }
  local_14 = 42.0;
  Imath_3_2::Interval<float>::Interval(&local_1c,&local_14);
  bVar1 = false;
  if ((local_1c.min == local_14) && (!NAN(local_1c.min) && !NAN(local_14))) {
    bVar1 = local_1c.max == local_14;
  }
  if (!bVar1) {
    __assert_fail("b.min == p && b.max == p",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x32,"void (anonymous namespace)::testConstructors(const char *) [T = float]");
  }
  local_20 = 42.0;
  local_24 = 666.0;
  Imath_3_2::Interval<float>::Interval(&local_2c,&local_20,&local_24);
  bVar1 = false;
  if ((local_2c.min == local_20) && (!NAN(local_2c.min) && !NAN(local_20))) {
    bVar1 = local_2c.max == local_24;
  }
  if (!bVar1) {
    __assert_fail("b.min == p0 && b.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x3c,"void (anonymous namespace)::testConstructors(const char *) [T = float]");
  }
  local_30 = 666.0;
  local_34 = 42.0;
  Imath_3_2::Interval<float>::Interval(&local_3c,&local_30,&local_34);
  bVar1 = false;
  if ((local_3c.min == local_30) && (!NAN(local_3c.min) && !NAN(local_30))) {
    bVar1 = local_3c.max == local_34;
  }
  if (!bVar1) {
    __assert_fail("b.min == p0 && b.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x43,"void (anonymous namespace)::testConstructors(const char *) [T = float]");
  }
  return;
}

Assistant:

static void
testConstructors (const char* type)
{
    cout << "    constructors for type " << type << endl;

    //
    // Empty
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }

    //
    // Single point
    //
    {
        T                                     p (42);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (p);
        assert (b.min == p && b.max == p);
    }

    //
    // Min and max
    //
    {
        T                                     p0 (42);
        T                                     p1 (666);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (p0, p1);
        assert (b.min == p0 && b.max == p1);
    }

    {
        T                                     p0 (666);
        T                                     p1 (42);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (p0, p1);
        assert (b.min == p0 && b.max == p1);
    }
}